

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O2

void __thiscall Pda::createDot(Pda *this)

{
  pointer ppNVar1;
  Pda *n;
  pointer ppTVar2;
  pointer ppTVar3;
  bool bVar4;
  string *psVar5;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *pvVar6;
  Node *pNVar7;
  Node *pNVar8;
  pointer __x;
  Pda *this_00;
  Pda *this_01;
  pointer ppNVar9;
  pointer ppTVar10;
  string to_png;
  string s;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> used;
  string e;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> ends;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream file;
  
  std::ofstream::ofstream(&file,"PDA.dot",_S_out);
  psVar5 = Tjen::Node::getName_abi_cxx11_(this->start);
  std::__cxx11::string::string((string *)&start,(string *)psVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"digraph {\nrankdir=LR \n",(allocator<char> *)&e);
  std::operator+(&to_png,"invis -> ",&start);
  std::operator+(&e,&to_png," \n");
  std::__cxx11::string::~string((string *)&to_png);
  std::__cxx11::string::append((char *)&s);
  this_00 = (Pda *)&ends;
  std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::vector
            ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)this_00,&this->endNodes);
  ppNVar1 = (this->allNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  for (ppNVar9 = (this->allNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppNVar9 != ppNVar1; ppNVar9 = ppNVar9 + 1
      ) {
    n = (Pda *)*ppNVar9;
    bVar4 = checkForNode(this_00,&ends,(Node *)n);
    if (bVar4) {
      psVar5 = Tjen::Node::getName_abi_cxx11_((Node *)n);
      std::operator+(&to_png,psVar5," [shape=doublecircle] \n");
      std::__cxx11::string::append((string *)&s);
      std::__cxx11::string::~string((string *)&to_png);
    }
    used.super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    used.super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    used.super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_01 = n;
    pvVar6 = Tjen::Node::getTransitions((Node *)n);
    ppTVar2 = (pvVar6->
              super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (__x = (pvVar6->
               super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
               )._M_impl.super__Vector_impl_data._M_start; this_00 = (Pda *)&used, __x != ppTVar2;
        __x = __x + 1) {
      bVar4 = checkForTrans(this_01,(vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                                     *)this_00,*__x);
      if (!bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&to_png,"[label=\"",(allocator<char> *)&local_290);
        pvVar6 = Tjen::Node::getTransitions((Node *)n);
        ppTVar3 = (pvVar6->
                  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        for (ppTVar10 = (pvVar6->
                        super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                        )._M_impl.super__Vector_impl_data._M_start; ppTVar10 != ppTVar3;
            ppTVar10 = ppTVar10 + 1) {
          pNVar7 = Tjen::Node::Transition::getTo(*__x);
          pNVar8 = Tjen::Node::Transition::getTo(*ppTVar10);
          if (pNVar7 == pNVar8) {
            Tjen::Node::Transition::getInput(*__x);
            std::__cxx11::string::push_back((char)&to_png);
            std::__cxx11::string::append((char *)&to_png);
            Tjen::Node::Transition::getOldStack(*__x);
            std::__cxx11::string::push_back((char)&to_png);
            psVar5 = Tjen::Node::Transition::getNewstack_abi_cxx11_(*__x);
            std::operator+(&local_2d0,"/",psVar5);
            std::operator+(&local_290,&local_2d0,"\\n");
            std::__cxx11::string::append((string *)&to_png);
            std::__cxx11::string::~string((string *)&local_290);
            std::__cxx11::string::~string((string *)&local_2d0);
          }
        }
        std::__cxx11::string::append((char *)&to_png);
        psVar5 = Tjen::Node::getName_abi_cxx11_((Node *)n);
        std::operator+(&local_2b0,psVar5," -> ");
        pNVar7 = Tjen::Node::Transition::getTo(*__x);
        psVar5 = Tjen::Node::getName_abi_cxx11_(pNVar7);
        std::operator+(&local_250,&local_2b0,psVar5);
        std::operator+(&local_2d0,&local_250,&to_png);
        std::operator+(&local_290,&local_2d0,"\n");
        std::__cxx11::string::append((string *)&e);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::push_back
                  (&used,__x);
        this_01 = (Pda *)&to_png;
        std::__cxx11::string::~string((string *)&to_png);
      }
    }
    std::_Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::
    ~_Vector_base((_Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                   *)this_00);
  }
  std::operator+(&to_png,&e,"}");
  std::__cxx11::string::append((string *)&s);
  std::__cxx11::string::~string((string *)&to_png);
  std::operator<<((ostream *)&file,(string *)&s);
  std::ofstream::close();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&to_png,"dot PDA.dot -Tpng -o PDA.png",(allocator<char> *)&local_290);
  system("dot PDA.dot -Tpng -o PDA.png");
  std::__cxx11::string::~string((string *)&to_png);
  std::_Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::~_Vector_base
            (&ends.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string((string *)&start);
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void Pda::createDot() {

    //file aanmaak en init stuff
    std::ofstream file ("PDA.dot");
    std::string start = this->getStart()->getName();
    std::string s = "digraph {\nrankdir=LR \n";
    std::string e = "invis -> "+ start + " \n";
    s+= "invis [style=invisible] \n";

    //endstates dubbele rand geven
    std::vector<Tjen::Node*> ends = this->getEndNodes();
    for (Tjen::Node* node: this->getAllNodes()) {
        if(checkForNode(ends, node)){
            s+= node->getName() + " [shape=doublecircle] \n";
        }


        //transities toevoegen
        std::vector<Tjen::Node::Transition*> used;
        for (auto& t: node->getTransitions()) {
            if (!checkForTrans(used, t)) {
                std::string label = "[label=\"";
                for (auto &t2: node->getTransitions()) {
                    if (t->getTo() == t2->getTo()) {
                        label += t->getInput();
                        label += ", ";
                        label += t->getOldStack();
                        label += "/" + t->getNewstack() + "\\n";
                    }
                }
                label += "\"]";

                e += node->getName() + " -> " + t->getTo()->getName() + label + "\n";
                used.push_back(t);
            }
        }
    }

    s+=e +"}";
    file << s;
    file.close();

    //convergeer commando
    std::string to_png = "dot PDA.dot -Tpng -o PDA.png";
    system("dot PDA.dot -Tpng -o PDA.png");
}